

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_QuicLegacyCodepointDisabled_Test::TestBody
          (QUICMethodTest_QuicLegacyCodepointDisabled_Test *this)

{
  int iVar1;
  size_t in_RCX;
  char *in_R9;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  AssertHelper AStack_88;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  uint8_t kServerParams [3];
  string local_70;
  AssertionResult gtest_ar_;
  uint8_t kClientParams [4];
  SSL_QUIC_METHOD quic_method;
  
  quic_method.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  quic_method.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  quic_method.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  quic_method.flush_flight = QUICMethodTest::FlushFlightCallback;
  quic_method.send_alert = QUICMethodTest::SendAlertCallback;
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1fd8,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)&gtest_ar_,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1fd9,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.success_ = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (gtest_ar_.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        builtin_memcpy(kClientParams,"\x01\x02\x03\x04",4);
        kServerParams[2] = '\a';
        kServerParams[0] = '\x05';
        kServerParams[1] = '\x06';
        SSL_set_quic_use_legacy_codepoint
                  ((this->super_QUICMethodTest).client_._M_t.
                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
        SSL_set_quic_use_legacy_codepoint
                  ((this->super_QUICMethodTest).server_._M_t.
                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
        iVar1 = SSL_set_quic_transport_params
                          ((this->super_QUICMethodTest).client_._M_t.
                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,kClientParams,4);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_70,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "SSL_set_quic_transport_params(client_.get(), kClientParams, sizeof(kClientParams))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fe1,local_70._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar1 = SSL_set_quic_transport_params
                            ((this->super_QUICMethodTest).server_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,kServerParams,3);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "SSL_set_quic_transport_params(server_.get(), kServerParams, sizeof(kServerParams))"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1fe3,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            gtest_ar_.success_ =
                 QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (gtest_ar_.success_) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              expected.size_ = in_RCX;
              expected.data_ = (uchar *)0x3;
              ExpectReceivedTransportParamsEqual
                        ((anon_unknown_0 *)
                         (this->super_QUICMethodTest).client_._M_t.
                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(SSL *)kServerParams,
                         expected);
              expected_00.size_ = in_RCX;
              expected_00.data_ = &DAT_00000004;
              ExpectReceivedTransportParamsEqual
                        ((anon_unknown_0 *)
                         (this->super_QUICMethodTest).server_._M_t.
                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(SSL *)kClientParams,
                         expected_00);
              return;
            }
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&gtest_ar_,
                       (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1fe5,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_70,(internal *)&gtest_ar_,(AssertionResult *)"CreateClientAndServer()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fdb,local_70._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_88);
  std::__cxx11::string::~string((string *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_80._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(QUICMethodTest, QuicLegacyCodepointDisabled) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  uint8_t kClientParams[] = {1, 2, 3, 4};
  uint8_t kServerParams[] = {5, 6, 7};
  SSL_set_quic_use_legacy_codepoint(client_.get(), 0);
  SSL_set_quic_use_legacy_codepoint(server_.get(), 0);
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), kClientParams,
                                            sizeof(kClientParams)));
  ASSERT_TRUE(SSL_set_quic_transport_params(server_.get(), kServerParams,
                                            sizeof(kServerParams)));

  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectReceivedTransportParamsEqual(client_.get(), kServerParams);
  ExpectReceivedTransportParamsEqual(server_.get(), kClientParams);
}